

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O3

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/array_object.cpp:661:59)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:661:59)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  bool bVar1;
  uint32_t uVar2;
  long *plVar3;
  undefined8 *puVar4;
  global_object *this_00;
  object *poVar5;
  uint *puVar6;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar7;
  undefined8 extraout_RDX_02;
  pointer pvVar8;
  value *pvVar9;
  long lVar10;
  gc_heap *this_01;
  uint uVar11;
  mjs *this_02;
  initializer_list<mjs::value> __l;
  initializer_list<mjs::value> __l_00;
  object_ptr o;
  wstring is;
  value callback;
  value kval;
  value this_arg;
  value res;
  allocator_type local_1a9;
  gc_heap_ptr_untyped local_1a8;
  undefined1 local_198 [32];
  gc_heap_ptr_untyped local_178;
  value local_168;
  undefined4 local_140;
  double local_138;
  undefined4 local_118;
  gc_heap_ptr_untyped local_110 [2];
  value *local_f0;
  value local_e8;
  vector<mjs::value,_std::allocator<mjs::value>_> local_c0;
  value local_a8;
  value local_80;
  value local_58;
  
  local_178.heap_ = (this->f).global.super_gc_heap_ptr_untyped.heap_;
  local_178.pos_ = (this->f).global.super_gc_heap_ptr_untyped.pos_;
  local_f0 = __return_storage_ptr__;
  if (local_178.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_178.heap_,&local_178);
  }
  plVar3 = (long *)gc_heap_ptr_untyped::get(&local_178);
  (**(code **)(*plVar3 + 0x88))(&local_1a8,plVar3,this_);
  puVar4 = (undefined8 *)gc_heap_ptr_untyped::get(&local_1a8);
  local_e8.type_ = reference;
  local_e8._4_4_ = 0;
  local_e8.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)0x1a89f8;
  (**(code **)*puVar4)(&local_168,puVar4);
  uVar2 = to_uint32(&local_168);
  value::destroy(&local_168);
  pvVar8 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pvVar8 == (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    pvVar8 = (pointer)&value::undefined;
  }
  value::value(&local_e8,pvVar8);
  this_00 = (global_object *)gc_heap_ptr_untyped::get(&local_178);
  plVar3 = (long *)gc_heap_ptr_untyped::get(&local_178);
  (**(code **)(*plVar3 + 0x60))(&local_168,plVar3);
  global_object::validate_type(this_00,&local_e8,(object_ptr *)&local_168,"function");
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_168);
  pvVar8 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)(((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pvVar8 >> 3) * -0x3333333333333333) <
      2) {
    pvVar9 = (value *)&value::undefined;
  }
  else {
    pvVar9 = pvVar8 + 1;
  }
  value::value(&local_80,pvVar9);
  if (uVar2 < 0x10000) {
    if (uVar2 != 0) {
      this_02 = (mjs *)0x0;
      uVar7 = extraout_RDX;
      do {
        index_string_abi_cxx11_((wstring *)local_198,this_02,(uint32_t)uVar7);
        poVar5 = (object *)gc_heap_ptr_untyped::get(&local_1a8);
        local_168._0_8_ = local_198._8_8_;
        local_168.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
             (gc_heap *)local_198._0_8_;
        bVar1 = object::has_property(poVar5,(wstring_view *)&local_168);
        uVar7 = extraout_RDX_00;
        if (bVar1) {
          puVar4 = (undefined8 *)gc_heap_ptr_untyped::get(&local_1a8);
          local_168._0_8_ = local_198._8_8_;
          local_168.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
               (gc_heap *)local_198._0_8_;
          (**(code **)*puVar4)(&local_a8,puVar4,&local_168);
          value::value(&local_168,&local_a8);
          local_138 = (double)(int)this_02;
          local_140 = 3;
          local_118 = 5;
          local_110[0].heap_ = local_1a8.heap_;
          local_110[0].pos_ = local_1a8.pos_;
          if (local_1a8.heap_ != (gc_heap *)0x0) {
            gc_heap::attach(local_1a8.heap_,local_110);
          }
          __l._M_len = 3;
          __l._M_array = &local_168;
          std::vector<mjs::value,_std::allocator<mjs::value>_>::vector(&local_c0,__l,&local_1a9);
          call_function(&local_58,&local_e8,&local_80,&local_c0);
          std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&local_c0);
          lVar10 = 0x50;
          do {
            value::destroy((value *)((long)&local_168.type_ + lVar10));
            lVar10 = lVar10 + -0x28;
          } while (lVar10 != -0x28);
          value::destroy(&local_58);
          value::destroy(&local_a8);
          uVar7 = extraout_RDX_01;
        }
        if ((gc_heap *)local_198._0_8_ != (gc_heap *)(local_198 + 0x10)) {
          operator_delete((void *)local_198._0_8_,local_198._16_8_ * 4 + 4);
          uVar7 = extraout_RDX_02;
        }
        uVar11 = (int)this_02 + 1;
        this_02 = (mjs *)(ulong)uVar11;
      } while (uVar11 != uVar2);
    }
  }
  else {
    poVar5 = (object *)gc_heap_ptr_untyped::get(&local_1a8);
    object::enumerable_property_names
              ((vector<mjs::string,_std::allocator<mjs::string>_> *)local_198,poVar5);
    if (local_198._0_8_ != local_198._8_8_) {
      this_01 = (gc_heap *)local_198._0_8_;
      do {
        puVar6 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_01);
        local_168.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
             (gc_heap *)(puVar6 + 1);
        local_168._0_8_ = ZEXT48(*puVar6);
        uVar2 = index_value_from_string((wstring_view *)&local_168);
        if (uVar2 != 0xffffffff) {
          puVar4 = (undefined8 *)gc_heap_ptr_untyped::get(&local_1a8);
          puVar6 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_01);
          local_168.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
               (gc_heap *)(puVar6 + 1);
          local_168._0_8_ = ZEXT48(*puVar6);
          (**(code **)*puVar4)(&local_a8,puVar4,&local_168);
          value::value(&local_168,&local_a8);
          local_138 = (double)uVar2;
          local_140 = 3;
          local_118 = 5;
          local_110[0].heap_ = local_1a8.heap_;
          local_110[0].pos_ = local_1a8.pos_;
          if (local_1a8.heap_ != (gc_heap *)0x0) {
            gc_heap::attach(local_1a8.heap_,local_110);
          }
          __l_00._M_len = 3;
          __l_00._M_array = &local_168;
          std::vector<mjs::value,_std::allocator<mjs::value>_>::vector(&local_c0,__l_00,&local_1a9);
          call_function(&local_58,&local_e8,&local_80,&local_c0);
          std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&local_c0);
          lVar10 = 0x50;
          do {
            value::destroy((value *)((long)&local_168.type_ + lVar10));
            lVar10 = lVar10 + -0x28;
          } while (lVar10 != -0x28);
          value::destroy(&local_58);
          value::destroy(&local_a8);
        }
        this_01 = (gc_heap *)&this_01->alloc_context_;
      } while (this_01 != (gc_heap *)local_198._8_8_);
    }
    std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector
              ((vector<mjs::string,_std::allocator<mjs::string>_> *)local_198);
  }
  value::destroy(&local_80);
  value::destroy(&local_e8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_1a8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_178);
  pvVar9 = local_f0;
  value::value(local_f0,(value *)&value::undefined);
  return pvVar9;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }